

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  byte bVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  float fVar44;
  float fVar48;
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  float fVar76;
  undefined1 auVar75 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  undefined1 auVar83 [64];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_a38;
  undefined8 uStack_a30;
  int local_a1c;
  undefined1 local_a18 [16];
  RayQueryContext *local_a00;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  long local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  int *local_958;
  undefined8 local_950;
  RTCRayQueryContext *local_948;
  Ray *local_940;
  undefined4 *local_938;
  undefined4 local_930;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar44 = ray->tfar;
    if (0.0 <= fVar44) {
      local_a00 = context;
      local_990 = local_7d8 + 1;
      aVar3 = (ray->dir).field_0;
      auVar45 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx((undefined1  [16])aVar3,auVar74);
      auVar77._8_4_ = 0x219392ef;
      auVar77._0_8_ = 0x219392ef219392ef;
      auVar77._12_4_ = 0x219392ef;
      auVar74 = vcmpps_avx(auVar74,auVar77,1);
      auVar74 = vblendvps_avx((undefined1  [16])aVar3,auVar77,auVar74);
      auVar77 = vrcpps_avx(auVar74);
      fVar48 = auVar77._0_4_;
      auVar71._0_4_ = fVar48 * auVar74._0_4_;
      fVar49 = auVar77._4_4_;
      auVar71._4_4_ = fVar49 * auVar74._4_4_;
      fVar50 = auVar77._8_4_;
      auVar71._8_4_ = fVar50 * auVar74._8_4_;
      fVar76 = auVar77._12_4_;
      auVar71._12_4_ = fVar76 * auVar74._12_4_;
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar74 = vsubps_avx(auVar78,auVar71);
      auVar72._0_4_ = fVar48 + fVar48 * auVar74._0_4_;
      auVar72._4_4_ = fVar49 + fVar49 * auVar74._4_4_;
      auVar72._8_4_ = fVar50 + fVar50 * auVar74._8_4_;
      auVar72._12_4_ = fVar76 + fVar76 * auVar74._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_8a8._4_4_ = uVar2;
      local_8a8._0_4_ = uVar2;
      local_8a8._8_4_ = uVar2;
      local_8a8._12_4_ = uVar2;
      auVar80 = ZEXT1664(local_8a8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8b8._4_4_ = uVar2;
      local_8b8._0_4_ = uVar2;
      local_8b8._8_4_ = uVar2;
      local_8b8._12_4_ = uVar2;
      auVar81 = ZEXT1664(local_8b8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8c8._4_4_ = uVar2;
      local_8c8._0_4_ = uVar2;
      local_8c8._8_4_ = uVar2;
      local_8c8._12_4_ = uVar2;
      auVar82 = ZEXT1664(local_8c8);
      local_8d8 = vshufps_avx(auVar72,auVar72,0);
      auVar83 = ZEXT1664(local_8d8);
      auVar74 = vmovshdup_avx(auVar72);
      local_8e8 = vshufps_avx(auVar72,auVar72,0x55);
      auVar87 = ZEXT1664(local_8e8);
      auVar77 = vshufpd_avx(auVar72,auVar72,1);
      local_8f8 = vshufps_avx(auVar72,auVar72,0xaa);
      auVar73 = ZEXT1664(local_8f8);
      local_998 = (ulong)(auVar72._0_4_ < 0.0) << 4;
      uVar41 = (ulong)(auVar74._0_4_ < 0.0) << 4 | 0x20;
      uVar40 = (ulong)(auVar77._0_4_ < 0.0) << 4 | 0x40;
      uVar42 = local_998 ^ 0x10;
      local_908 = vshufps_avx(auVar45,auVar45,0);
      auVar75 = ZEXT1664(local_908);
      local_918 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
      auVar79 = ZEXT1664(local_918);
      local_928 = mm_lookupmask_ps._240_16_;
LAB_00b64404:
      if (local_990 != local_7d8) {
        uVar43 = local_990[-1];
        local_990 = local_990 + -1;
        while ((uVar43 & 8) == 0) {
          auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + local_998),auVar80._0_16_);
          auVar45._0_4_ = auVar83._0_4_ * auVar74._0_4_;
          auVar45._4_4_ = auVar83._4_4_ * auVar74._4_4_;
          auVar45._8_4_ = auVar83._8_4_ * auVar74._8_4_;
          auVar45._12_4_ = auVar83._12_4_ * auVar74._12_4_;
          auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar41),auVar81._0_16_);
          auVar51._0_4_ = auVar87._0_4_ * auVar74._0_4_;
          auVar51._4_4_ = auVar87._4_4_ * auVar74._4_4_;
          auVar51._8_4_ = auVar87._8_4_ * auVar74._8_4_;
          auVar51._12_4_ = auVar87._12_4_ * auVar74._12_4_;
          auVar74 = vpmaxsd_avx(auVar45,auVar51);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar40),auVar82._0_16_);
          auVar52._0_4_ = auVar73._0_4_ * auVar45._0_4_;
          auVar52._4_4_ = auVar73._4_4_ * auVar45._4_4_;
          auVar52._8_4_ = auVar73._8_4_ * auVar45._8_4_;
          auVar52._12_4_ = auVar73._12_4_ * auVar45._12_4_;
          auVar45 = vpmaxsd_avx(auVar52,auVar75._0_16_);
          auVar74 = vpmaxsd_avx(auVar74,auVar45);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar42),auVar80._0_16_);
          auVar53._0_4_ = auVar83._0_4_ * auVar45._0_4_;
          auVar53._4_4_ = auVar83._4_4_ * auVar45._4_4_;
          auVar53._8_4_ = auVar83._8_4_ * auVar45._8_4_;
          auVar53._12_4_ = auVar83._12_4_ * auVar45._12_4_;
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar41 ^ 0x10)),
                               auVar81._0_16_);
          auVar63._0_4_ = auVar87._0_4_ * auVar45._0_4_;
          auVar63._4_4_ = auVar87._4_4_ * auVar45._4_4_;
          auVar63._8_4_ = auVar87._8_4_ * auVar45._8_4_;
          auVar63._12_4_ = auVar87._12_4_ * auVar45._12_4_;
          auVar45 = vpminsd_avx(auVar53,auVar63);
          auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar40 ^ 0x10)),
                               auVar82._0_16_);
          auVar64._0_4_ = auVar73._0_4_ * auVar77._0_4_;
          auVar64._4_4_ = auVar73._4_4_ * auVar77._4_4_;
          auVar64._8_4_ = auVar73._8_4_ * auVar77._8_4_;
          auVar64._12_4_ = auVar73._12_4_ * auVar77._12_4_;
          auVar77 = vpminsd_avx(auVar64,auVar79._0_16_);
          auVar45 = vpminsd_avx(auVar45,auVar77);
          auVar74 = vpcmpgtd_avx(auVar74,auVar45);
          iVar35 = vmovmskps_avx(auVar74);
          if (iVar35 == 0xf) goto LAB_00b64404;
          bVar34 = (byte)iVar35 ^ 0xf;
          uVar36 = uVar43 & 0xfffffffffffffff0;
          lVar39 = 0;
          if (bVar34 != 0) {
            for (; (bVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar43 = *(ulong *)(uVar36 + lVar39 * 8);
          uVar37 = bVar34 - 1 & (uint)bVar34;
          uVar38 = (ulong)uVar37;
          if (uVar37 != 0) {
            do {
              *local_990 = uVar43;
              local_990 = local_990 + 1;
              lVar39 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              uVar43 = *(ulong *)(uVar36 + lVar39 * 8);
              uVar38 = uVar38 - 1 & uVar38;
            } while (uVar38 != 0);
          }
        }
        local_9a0 = (ulong)((uint)uVar43 & 0xf) - 8;
        uVar43 = uVar43 & 0xfffffffffffffff0;
        for (local_9a8 = 0; local_9a8 != local_9a0; local_9a8 = local_9a8 + 1) {
          lVar39 = local_9a8 * 0xb0;
          pfVar1 = (float *)(uVar43 + 0x80 + lVar39);
          fVar14 = *pfVar1;
          fVar15 = pfVar1[1];
          fVar16 = pfVar1[2];
          fVar17 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + 0x40 + lVar39);
          fVar18 = *pfVar1;
          fVar19 = pfVar1[1];
          fVar20 = pfVar1[2];
          fVar21 = pfVar1[3];
          auVar46._0_4_ = fVar14 * fVar18;
          auVar46._4_4_ = fVar15 * fVar19;
          auVar46._8_4_ = fVar16 * fVar20;
          auVar46._12_4_ = fVar17 * fVar21;
          pfVar1 = (float *)(uVar43 + 0x70 + lVar39);
          fVar22 = *pfVar1;
          fVar23 = pfVar1[1];
          fVar24 = pfVar1[2];
          fVar25 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + 0x50 + lVar39);
          fVar26 = *pfVar1;
          fVar27 = pfVar1[1];
          fVar28 = pfVar1[2];
          fVar29 = pfVar1[3];
          auVar54._0_4_ = fVar22 * fVar26;
          auVar54._4_4_ = fVar23 * fVar27;
          auVar54._8_4_ = fVar24 * fVar28;
          auVar54._12_4_ = fVar25 * fVar29;
          local_9c8 = vsubps_avx(auVar54,auVar46);
          auVar74 = *(undefined1 (*) [16])(uVar43 + 0x60 + lVar39);
          fVar88 = auVar74._0_4_;
          auVar55._0_4_ = fVar88 * fVar26;
          fVar89 = auVar74._4_4_;
          auVar55._4_4_ = fVar89 * fVar27;
          fVar90 = auVar74._8_4_;
          auVar55._8_4_ = fVar90 * fVar28;
          fVar91 = auVar74._12_4_;
          auVar55._12_4_ = fVar91 * fVar29;
          pfVar1 = (float *)(uVar43 + 0x30 + lVar39);
          fVar30 = *pfVar1;
          fVar31 = pfVar1[1];
          fVar32 = pfVar1[2];
          fVar33 = pfVar1[3];
          auVar65._0_4_ = fVar14 * fVar30;
          auVar65._4_4_ = fVar15 * fVar31;
          auVar65._8_4_ = fVar16 * fVar32;
          auVar65._12_4_ = fVar17 * fVar33;
          local_a18 = vsubps_avx(auVar65,auVar55);
          auVar66._0_4_ = fVar22 * fVar30;
          auVar66._4_4_ = fVar23 * fVar31;
          auVar66._8_4_ = fVar24 * fVar32;
          auVar66._12_4_ = fVar25 * fVar33;
          auVar92._0_4_ = fVar88 * fVar18;
          auVar92._4_4_ = fVar89 * fVar19;
          auVar92._8_4_ = fVar90 * fVar20;
          auVar92._12_4_ = fVar91 * fVar21;
          auVar77 = vsubps_avx(auVar92,auVar66);
          uVar2 = *(undefined4 *)&(ray->org).field_0;
          auVar93._4_4_ = uVar2;
          auVar93._0_4_ = uVar2;
          auVar93._8_4_ = uVar2;
          auVar93._12_4_ = uVar2;
          local_9e8 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + lVar39),auVar93);
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar94._4_4_ = uVar2;
          auVar94._0_4_ = uVar2;
          auVar94._8_4_ = uVar2;
          auVar94._12_4_ = uVar2;
          local_9d8 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x10 + lVar39),auVar94);
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar95._4_4_ = uVar2;
          auVar95._0_4_ = uVar2;
          auVar95._8_4_ = uVar2;
          auVar95._12_4_ = uVar2;
          local_9f8 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + lVar39),auVar95);
          fVar44 = (ray->dir).field_0.m128[1];
          fVar48 = (ray->dir).field_0.m128[2];
          fVar50 = local_9f8._0_4_;
          auVar96._0_4_ = fVar44 * fVar50;
          fVar5 = local_9f8._4_4_;
          auVar96._4_4_ = fVar44 * fVar5;
          fVar8 = local_9f8._8_4_;
          auVar96._8_4_ = fVar44 * fVar8;
          fVar11 = local_9f8._12_4_;
          auVar96._12_4_ = fVar44 * fVar11;
          fVar76 = local_9d8._0_4_;
          auVar97._0_4_ = fVar48 * fVar76;
          fVar6 = local_9d8._4_4_;
          auVar97._4_4_ = fVar48 * fVar6;
          fVar9 = local_9d8._8_4_;
          auVar97._8_4_ = fVar48 * fVar9;
          fVar12 = local_9d8._12_4_;
          auVar97._12_4_ = fVar48 * fVar12;
          auVar45 = vsubps_avx(auVar97,auVar96);
          fVar49 = (ray->dir).field_0.m128[0];
          fVar4 = local_9e8._0_4_;
          auVar47._0_4_ = fVar48 * fVar4;
          fVar7 = local_9e8._4_4_;
          auVar47._4_4_ = fVar48 * fVar7;
          fVar10 = local_9e8._8_4_;
          auVar47._8_4_ = fVar48 * fVar10;
          fVar13 = local_9e8._12_4_;
          auVar47._12_4_ = fVar48 * fVar13;
          auVar56._0_4_ = fVar49 * fVar50;
          auVar56._4_4_ = fVar49 * fVar5;
          auVar56._8_4_ = fVar49 * fVar8;
          auVar56._12_4_ = fVar49 * fVar11;
          auVar71 = vsubps_avx(auVar56,auVar47);
          auVar57._0_4_ = fVar49 * fVar76;
          auVar57._4_4_ = fVar49 * fVar6;
          auVar57._8_4_ = fVar49 * fVar9;
          auVar57._12_4_ = fVar49 * fVar12;
          auVar67._0_4_ = fVar44 * fVar4;
          auVar67._4_4_ = fVar44 * fVar7;
          auVar67._8_4_ = fVar44 * fVar10;
          auVar67._12_4_ = fVar44 * fVar13;
          auVar72 = vsubps_avx(auVar67,auVar57);
          auVar78 = local_a18;
          auVar68._0_4_ =
               local_9c8._0_4_ * fVar49 + fVar44 * local_a18._0_4_ + fVar48 * auVar77._0_4_;
          auVar68._4_4_ =
               local_9c8._4_4_ * fVar49 + fVar44 * local_a18._4_4_ + fVar48 * auVar77._4_4_;
          auVar68._8_4_ =
               local_9c8._8_4_ * fVar49 + fVar44 * local_a18._8_4_ + fVar48 * auVar77._8_4_;
          auVar68._12_4_ =
               local_9c8._12_4_ * fVar49 + fVar44 * local_a18._12_4_ + fVar48 * auVar77._12_4_;
          auVar58._8_8_ = 0x8000000080000000;
          auVar58._0_8_ = 0x8000000080000000;
          auVar74 = vandps_avx(auVar68,auVar58);
          uVar37 = auVar74._0_4_;
          local_898._0_4_ =
               (float)(uVar37 ^ (uint)(fVar88 * auVar45._0_4_ +
                                      fVar14 * auVar72._0_4_ + fVar22 * auVar71._0_4_));
          uVar84 = auVar74._4_4_;
          local_898._4_4_ =
               (float)(uVar84 ^ (uint)(fVar89 * auVar45._4_4_ +
                                      fVar15 * auVar72._4_4_ + fVar23 * auVar71._4_4_));
          uVar85 = auVar74._8_4_;
          local_898._8_4_ =
               (float)(uVar85 ^ (uint)(fVar90 * auVar45._8_4_ +
                                      fVar16 * auVar72._8_4_ + fVar24 * auVar71._8_4_));
          uVar86 = auVar74._12_4_;
          local_898._12_4_ =
               (float)(uVar86 ^ (uint)(fVar91 * auVar45._12_4_ +
                                      fVar17 * auVar72._12_4_ + fVar25 * auVar71._12_4_));
          local_888._0_4_ =
               (float)(uVar37 ^ (uint)(fVar30 * auVar45._0_4_ +
                                      fVar26 * auVar72._0_4_ + fVar18 * auVar71._0_4_));
          local_888._4_4_ =
               (float)(uVar84 ^ (uint)(fVar31 * auVar45._4_4_ +
                                      fVar27 * auVar72._4_4_ + fVar19 * auVar71._4_4_));
          local_888._8_4_ =
               (float)(uVar85 ^ (uint)(fVar32 * auVar45._8_4_ +
                                      fVar28 * auVar72._8_4_ + fVar20 * auVar71._8_4_));
          local_888._12_4_ =
               (float)(uVar86 ^ (uint)(fVar33 * auVar45._12_4_ +
                                      fVar29 * auVar72._12_4_ + fVar21 * auVar71._12_4_));
          auVar71 = ZEXT416(0) << 0x20;
          auVar74 = vcmpps_avx(local_898,auVar71,5);
          auVar45 = vcmpps_avx(local_888,auVar71,5);
          auVar74 = vandps_avx(auVar74,auVar45);
          auVar59._8_4_ = 0x7fffffff;
          auVar59._0_8_ = 0x7fffffff7fffffff;
          auVar59._12_4_ = 0x7fffffff;
          local_868 = vandps_avx(auVar68,auVar59);
          auVar45 = vcmpps_avx(auVar71,auVar68,4);
          auVar74 = vandps_avx(auVar74,auVar45);
          auVar60._0_4_ = local_898._0_4_ + local_888._0_4_;
          auVar60._4_4_ = local_898._4_4_ + local_888._4_4_;
          auVar60._8_4_ = local_898._8_4_ + local_888._8_4_;
          auVar60._12_4_ = local_898._12_4_ + local_888._12_4_;
          auVar45 = vcmpps_avx(auVar60,local_868,2);
          auVar74 = vandps_avx(auVar74,auVar45);
          auVar45 = local_928 & auVar74;
          if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar45[0xf] < '\0') {
            auVar74 = vandps_avx(auVar74,local_928);
            local_878._0_4_ =
                 (float)(uVar37 ^ (uint)(local_9c8._0_4_ * fVar4 +
                                        fVar76 * local_a18._0_4_ + fVar50 * auVar77._0_4_));
            local_878._4_4_ =
                 (float)(uVar84 ^ (uint)(local_9c8._4_4_ * fVar7 +
                                        fVar6 * local_a18._4_4_ + fVar5 * auVar77._4_4_));
            local_878._8_4_ =
                 (float)(uVar85 ^ (uint)(local_9c8._8_4_ * fVar10 +
                                        fVar9 * local_a18._8_4_ + fVar8 * auVar77._8_4_));
            local_878._12_4_ =
                 (float)(uVar86 ^ (uint)(local_9c8._12_4_ * fVar13 +
                                        fVar12 * local_a18._12_4_ + fVar11 * auVar77._12_4_));
            fVar44 = (ray->org).field_0.m128[3];
            fVar48 = local_868._0_4_;
            auVar61._0_4_ = fVar48 * fVar44;
            fVar49 = local_868._4_4_;
            auVar61._4_4_ = fVar49 * fVar44;
            fVar50 = local_868._8_4_;
            auVar61._8_4_ = fVar50 * fVar44;
            fVar76 = local_868._12_4_;
            auVar61._12_4_ = fVar76 * fVar44;
            auVar45 = vcmpps_avx(auVar61,local_878,1);
            fVar44 = ray->tfar;
            auVar69._0_4_ = fVar48 * fVar44;
            auVar69._4_4_ = fVar49 * fVar44;
            auVar69._8_4_ = fVar50 * fVar44;
            auVar69._12_4_ = fVar76 * fVar44;
            auVar71 = vcmpps_avx(local_878,auVar69,2);
            auVar45 = vandps_avx(auVar71,auVar45);
            local_848 = vandps_avx(auVar45,auVar74);
            uVar37 = vmovmskps_avx(local_848);
            if (uVar37 != 0) {
              local_808 = local_9c8;
              local_7f8 = local_a18._0_8_;
              uStack_7f0 = local_a18._8_8_;
              local_a38 = auVar77._0_8_;
              uStack_a30 = auVar77._8_8_;
              local_7e8 = local_a38;
              uStack_7e0 = uStack_a30;
              local_9c8._0_8_ = local_a00->scene;
              auVar74 = vrcpps_avx(local_868);
              fVar44 = auVar74._0_4_;
              auVar62._0_4_ = fVar48 * fVar44;
              fVar48 = auVar74._4_4_;
              auVar62._4_4_ = fVar49 * fVar48;
              fVar49 = auVar74._8_4_;
              auVar62._8_4_ = fVar50 * fVar49;
              fVar50 = auVar74._12_4_;
              auVar62._12_4_ = fVar76 * fVar50;
              auVar70._8_4_ = 0x3f800000;
              auVar70._0_8_ = 0x3f8000003f800000;
              auVar70._12_4_ = 0x3f800000;
              auVar74 = vsubps_avx(auVar70,auVar62);
              fVar44 = fVar44 + fVar44 * auVar74._0_4_;
              fVar48 = fVar48 + fVar48 * auVar74._4_4_;
              fVar49 = fVar49 + fVar49 * auVar74._8_4_;
              fVar50 = fVar50 + fVar50 * auVar74._12_4_;
              local_818[0] = fVar44 * local_878._0_4_;
              local_818[1] = fVar48 * local_878._4_4_;
              local_818[2] = fVar49 * local_878._8_4_;
              local_818[3] = fVar50 * local_878._12_4_;
              local_838._0_4_ = fVar44 * local_898._0_4_;
              local_838._4_4_ = fVar48 * local_898._4_4_;
              local_838._8_4_ = fVar49 * local_898._8_4_;
              local_838._12_4_ = fVar50 * local_898._12_4_;
              local_828._0_4_ = fVar44 * local_888._0_4_;
              local_828._4_4_ = fVar48 * local_888._4_4_;
              local_828._8_4_ = fVar49 * local_888._8_4_;
              local_828._12_4_ = fVar50 * local_888._12_4_;
              uVar36 = (ulong)(uVar37 & 0xff);
              local_9e8._0_8_ = lVar39 + uVar43;
              lVar39 = lVar39 + uVar43;
              local_a18 = auVar78;
              do {
                uVar38 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                local_a18._0_8_ = uVar38;
                local_970 = *(uint *)(lVar39 + 0x90 + uVar38 * 4);
                local_9b0 = *(long *)(*(long *)(local_9c8._0_8_ + 0x1e8) + (ulong)local_970 * 8);
                if ((*(uint *)(local_9b0 + 0x34) & ray->mask) == 0) {
                  uVar36 = uVar36 ^ 1L << (uVar38 & 0x3f);
                }
                else {
                  local_9d8._0_8_ = uVar36;
                  if ((local_a00->args->filter == (RTCFilterFunctionN)0x0) &&
                     (*(long *)(local_9b0 + 0x48) == 0)) {
LAB_00b64a4a:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_9f8._0_8_ = local_a00->args;
                  local_948 = local_a00->user;
                  local_988 = *(undefined4 *)(local_808 + uVar38 * 4);
                  local_984 = *(undefined4 *)((long)&local_7f8 + uVar38 * 4);
                  local_980 = *(undefined4 *)((long)&local_7e8 + uVar38 * 4);
                  local_97c = *(undefined4 *)(local_838 + uVar38 * 4);
                  local_978 = *(undefined4 *)(local_828 + uVar38 * 4);
                  local_974 = *(undefined4 *)(local_9e8._0_8_ + 0xa0 + uVar38 * 4);
                  local_96c = local_948->instID[0];
                  local_968 = local_948->instPrimID[0];
                  fVar44 = ray->tfar;
                  ray->tfar = local_818[uVar38];
                  local_a1c = -1;
                  local_958 = &local_a1c;
                  local_950 = *(undefined8 *)(local_9b0 + 0x18);
                  local_938 = &local_988;
                  local_930 = 1;
                  local_940 = ray;
                  if ((*(code **)(local_9b0 + 0x48) == (code *)0x0) ||
                     ((**(code **)(local_9b0 + 0x48))(&local_958), *local_958 != 0)) {
                    if ((*(code **)(local_9f8._0_8_ + 0x10) == (code *)0x0) ||
                       ((((*(byte *)local_9f8._0_8_ & 2) == 0 &&
                         ((*(byte *)(local_9b0 + 0x3e) & 0x40) == 0)) ||
                        ((**(code **)(local_9f8._0_8_ + 0x10))(&local_958), *local_958 != 0))))
                    goto LAB_00b64a4a;
                  }
                  ray->tfar = fVar44;
                  uVar36 = local_9d8._0_8_ ^ 1L << (local_a18._0_8_ & 0x3f);
                }
                lVar39 = local_9e8._0_8_;
              } while (uVar36 != 0);
            }
          }
          auVar80 = ZEXT1664(local_8a8);
          auVar81 = ZEXT1664(local_8b8);
          auVar82 = ZEXT1664(local_8c8);
          auVar83 = ZEXT1664(local_8d8);
          auVar87 = ZEXT1664(local_8e8);
          auVar73 = ZEXT1664(local_8f8);
          auVar75 = ZEXT1664(local_908);
          auVar79 = ZEXT1664(local_918);
        }
        goto LAB_00b64404;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }